

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
AsyncRgbLedSimulationDataGenerator::GenerateSimulationData
          (AsyncRgbLedSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  ulong uVar1;
  ulong uVar2;
  int local_34;
  int t;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channel_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  AsyncRgbLedSimulationDataGenerator *this_local;
  
  uVar1 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while (uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber(), uVar2 < uVar1) {
    WriteReset(this);
    for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
      CreateRGBWord(this);
    }
    this->mFrameCount = this->mFrameCount + 1;
    if ((this->mFrameCount % 7 == 0) && ((this->mDoGenerateHighSpeedMode & 1U) != 0)) {
      this->mHighSpeedMode = (bool)((this->mHighSpeedMode ^ 0xffU) & 1);
    }
  }
  *simulation_channel = &this->mLEDSimulationData;
  return 1;
}

Assistant:

U32 AsyncRgbLedSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mLEDSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        WriteReset();

        // six RGB-triple cascade between resets, i.e six discrete LEDs
        // or two of the 3-LED combined drivers. We could perhaps make
        // this adjustable
        for( int t = 0; t < 6; ++t )
        {
            CreateRGBWord();
        }

        ++mFrameCount;

        // toggle high-speed mode every seven frames if it's supported
        if( ( ( mFrameCount % 7 ) == 0 ) && mDoGenerateHighSpeedMode )
        {
            mHighSpeedMode = !mHighSpeedMode;
        }
    }

    *simulation_channel = &mLEDSimulationData;
    return 1;
}